

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void paeth_predictor(uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  uint16_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar1 = above[-1];
  uVar6 = 0;
  uVar5 = (ulong)(uint)bw;
  if (bw < 1) {
    uVar5 = uVar6;
  }
  uVar3 = (ulong)(uint)bh;
  if (bh < 1) {
    uVar3 = uVar6;
  }
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = paeth_predictor_single((ushort)left[uVar6],(ushort)above[uVar4],(ushort)bVar1);
      dst[uVar4] = (uint8_t)uVar2;
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void paeth_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                   int bh, const uint8_t *above,
                                   const uint8_t *left) {
  int r, c;
  const uint8_t ytop_left = above[-1];

  for (r = 0; r < bh; r++) {
    for (c = 0; c < bw; c++)
      dst[c] = (uint8_t)paeth_predictor_single(left[r], above[c], ytop_left);
    dst += stride;
  }
}